

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [64];
  int iVar8;
  undefined1 (*pauVar9) [64];
  int iVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 in_ZMM4 [64];
  
  uVar1 = b->c;
  iVar8 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar5 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar5 = 0;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar12 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
      auVar13 = vbroadcastss_avx512f(ZEXT416(*a->data));
      pauVar7 = (undefined1 (*) [64])(b->cstep * uVar6 * b->elemsize + (long)b->data);
      pauVar9 = (undefined1 (*) [64])(c->cstep * uVar6 * c->elemsize + (long)c->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar8; iVar10 = iVar10 + 0x10) {
        auVar14 = vrcp14ps_avx512f(*pauVar7);
        auVar15 = vmulps_avx512f(auVar13,auVar14);
        auVar16 = vfmsub213ps_avx512f(*pauVar7,auVar15,auVar13);
        auVar14 = vfnmadd213ps_avx512f(auVar16,auVar14,auVar15);
        *pauVar9 = auVar14;
        pauVar7 = pauVar7 + 1;
        pauVar9 = pauVar9 + 1;
      }
      fVar17 = auVar13._0_4_;
      auVar19._4_4_ = fVar17;
      auVar19._0_4_ = fVar17;
      auVar19._8_4_ = fVar17;
      auVar19._12_4_ = fVar17;
      auVar19._16_4_ = fVar17;
      auVar19._20_4_ = fVar17;
      auVar19._24_4_ = fVar17;
      auVar19._28_4_ = fVar17;
      for (; iVar10 + 7 < iVar8; iVar10 = iVar10 + 8) {
        auVar3 = vrcpps_avx(*(undefined1 (*) [32])*pauVar7);
        auVar13._0_4_ = fVar17 * auVar3._0_4_;
        auVar13._4_4_ = fVar17 * auVar3._4_4_;
        auVar13._8_4_ = fVar17 * auVar3._8_4_;
        auVar13._12_4_ = fVar17 * auVar3._12_4_;
        auVar13._16_4_ = fVar17 * auVar3._16_4_;
        auVar13._20_4_ = fVar17 * auVar3._20_4_;
        auVar13._28_36_ = in_ZMM4._28_36_;
        auVar13._24_4_ = fVar17 * auVar3._24_4_;
        auVar21 = auVar13._0_32_;
        in_ZMM4 = ZEXT3264(auVar21);
        auVar18 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar7,auVar21,auVar19);
        auVar18 = vfnmadd213ps_fma(ZEXT1632(auVar18),auVar3,auVar21);
        *(undefined1 (*) [32])*pauVar9 = ZEXT1632(auVar18);
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
        pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x20);
      }
      auVar18._4_4_ = fVar17;
      auVar18._0_4_ = fVar17;
      auVar18._8_4_ = fVar17;
      auVar18._12_4_ = fVar17;
      for (; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar2 = vrcpps_avx(*(undefined1 (*) [16])*pauVar7);
        auVar20._0_4_ = fVar17 * auVar2._0_4_;
        auVar20._4_4_ = fVar17 * auVar2._4_4_;
        auVar20._8_4_ = fVar17 * auVar2._8_4_;
        auVar20._12_4_ = fVar17 * auVar2._12_4_;
        in_ZMM4 = ZEXT1664(auVar20);
        auVar4 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar7,auVar20,auVar18);
        auVar2 = vfnmadd213ps_fma(auVar4,auVar2,auVar20);
        *(undefined1 (*) [16])*pauVar9 = auVar2;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
        pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x10);
      }
      lVar11 = 0;
      for (; iVar10 < iVar8; iVar10 = iVar10 + 1) {
        *(float *)((long)*pauVar9 + lVar11) = fVar17 / *(float *)(*pauVar7 + lVar11);
        lVar11 = lVar11 + 4;
      }
    }
  }
  return iVar5;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}